

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O2

int testEqual(BDD a,BDD b)

{
  char *__ptr;
  
  if (a == b) {
    return 1;
  }
  if (a == 0xffffffffffffffff) {
    __ptr = "a is invalid!\n";
  }
  else {
    if (b != 0xffffffffffffffff) {
      fwrite("a and b are not equal!\n",0x17,1,_stderr);
      sylvan_fprint((FILE *)_stderr,a);
      fputc(10,_stderr);
      sylvan_fprint((FILE *)_stderr,b);
      fputc(10,_stderr);
      return 0;
    }
    __ptr = "b is invalid!\n";
  }
  fwrite(__ptr,0xe,1,_stderr);
  return 0;
}

Assistant:

int testEqual(BDD a, BDD b)
{
    if (a == b) return 1;

    if (a == sylvan_invalid) {
        fprintf(stderr, "a is invalid!\n");
        return 0;
    }

    if (b == sylvan_invalid) {
        fprintf(stderr, "b is invalid!\n");
        return 0;
    }

    fprintf(stderr, "a and b are not equal!\n");

    sylvan_fprint(stderr, a);fprintf(stderr, "\n");
    sylvan_fprint(stderr, b);fprintf(stderr, "\n");

    return 0;
}